

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O0

void __thiscall
cuckoocache_tests::test_cuckoocache_no_fakes::test_method(test_cuckoocache_no_fakes *this)

{
  long lVar1;
  uint256 e;
  uint uVar2;
  long in_FS_OFFSET;
  pair<unsigned_int,_unsigned_long> pVar3;
  int x_1;
  int x;
  size_t megabytes;
  cache<uint256,_SignatureCacheHasher> cc;
  _Head_base<0UL,_std::atomic<unsigned_char>_*,_false> in_stack_fffffffffffffe38;
  lazy_ostream *in_stack_fffffffffffffe40;
  assertion_result *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  BasicTestingSetup *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  lazy_ostream *in_stack_fffffffffffffe68;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined4 in_stack_fffffffffffffea0;
  int local_158;
  int local_154;
  const_string local_120 [2];
  lazy_ostream local_100 [2];
  assertion_result local_e0;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 local_48 [24];
  bit_packed_atomic_flags local_28;
  lazy_ostream *plStack_20;
  assertion_result *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest
            (in_stack_fffffffffffffe58,(SeedRand)(in_stack_fffffffffffffe50 >> 0x20));
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffe58);
  pVar3 = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
                    ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffe58,
                     in_stack_fffffffffffffe50);
  uVar2 = pVar3.first;
  for (local_154 = 0; local_154 < 100000; local_154 = local_154 + 1) {
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe68);
    e.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_ffffffffffffff48;
    e.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)in_stack_ffffffffffffff48 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[10] = (char)((uint)in_stack_ffffffffffffff48 >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((uint)in_stack_ffffffffffffff48 >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_ffffffffffffff40;
    e.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)in_stack_ffffffffffffff40 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)in_stack_ffffffffffffff40 >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)in_stack_ffffffffffffff40 >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    e.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)in_stack_ffffffffffffff40 >> 0x28);
    e.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)in_stack_ffffffffffffff40 >> 0x30);
    e.super_base_blob<256U>.m_data._M_elems[7] = (char)((ulong)in_stack_ffffffffffffff40 >> 0x38);
    e.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_ffffffffffffff4c;
    e.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((uint)in_stack_ffffffffffffff4c >> 8);
    e.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((uint)in_stack_ffffffffffffff4c >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((uint)in_stack_ffffffffffffff4c >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_stack_ffffffffffffff50;
    e.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)in_stack_ffffffffffffff50 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)in_stack_ffffffffffffff50 >> 0x10)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)in_stack_ffffffffffffff50 >> 0x18)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)in_stack_ffffffffffffff50 >> 0x20)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)in_stack_ffffffffffffff50 >> 0x28)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)in_stack_ffffffffffffff50 >> 0x30)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)in_stack_ffffffffffffff50 >> 0x38)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_stack_ffffffffffffff58;
    e.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((ulong)in_stack_ffffffffffffff58 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[0x1a] = (char)((ulong)in_stack_ffffffffffffff58 >> 0x10)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x1b] = (char)((ulong)in_stack_ffffffffffffff58 >> 0x18)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)((ulong)in_stack_ffffffffffffff58 >> 0x20)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((ulong)in_stack_ffffffffffffff58 >> 0x28)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((ulong)in_stack_ffffffffffffff58 >> 0x30)
    ;
    e.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((ulong)in_stack_ffffffffffffff58 >> 0x38)
    ;
    in_stack_fffffffffffffe38._M_head_impl =
         (atomic<unsigned_char> *)
         local_28.mem._M_t.
         super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
         .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl;
    in_stack_fffffffffffffe40 = plStack_20;
    in_stack_fffffffffffffe48 = local_18;
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
              ((cache<uint256,_SignatureCacheHasher> *)CONCAT44(uVar2,in_stack_fffffffffffffea0),e);
  }
  for (local_158 = 0; local_158 < 100000; local_158 = local_158 + 1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
                 (pointer)in_stack_fffffffffffffe40,
                 (unsigned_long)in_stack_fffffffffffffe38._M_head_impl);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38._M_head_impl);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                 (const_string *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
                 (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      in_stack_fffffffffffffe70 = (cache<uint256,_SignatureCacheHasher> *)local_48;
      RandomMixin<FastRandomContext>::rand256
                ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe7f =
           CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                     (in_stack_fffffffffffffe70,(uint256 *)in_stack_fffffffffffffe68,
                      (bool)in_stack_fffffffffffffe67);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffe48,SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0));
      in_stack_fffffffffffffe68 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
                 (pointer)in_stack_fffffffffffffe40,
                 (unsigned_long)in_stack_fffffffffffffe38._M_head_impl);
      boost::unit_test::operator<<
                (in_stack_fffffffffffffe40,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffe38._M_head_impl);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe48,
                 (pointer)in_stack_fffffffffffffe40,
                 (unsigned_long)in_stack_fffffffffffffe38._M_head_impl);
      in_stack_fffffffffffffe38._M_head_impl = (atomic<unsigned_char> *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_e0,local_100,local_120,0x30,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffe38._M_head_impl);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe38._M_head_impl);
      in_stack_fffffffffffffe67 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffe67);
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffe38._M_head_impl);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_cuckoocache_no_fakes)
{
    SeedRandomForTest(SeedRand::ZEROS);
    CuckooCache::cache<uint256, SignatureCacheHasher> cc{};
    size_t megabytes = 4;
    cc.setup_bytes(megabytes << 20);
    for (int x = 0; x < 100000; ++x) {
        cc.insert(m_rng.rand256());
    }
    for (int x = 0; x < 100000; ++x) {
        BOOST_CHECK(!cc.contains(m_rng.rand256(), false));
    }
}